

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O2

SQInteger SqModules::sqRequire<false>(HSQUIRRELVM vm)

{
  char *__s;
  SQUserPointer this;
  bool bVar1;
  int iVar2;
  SQRESULT SVar3;
  iterator iVar4;
  long n;
  long *plVar5;
  SQRESULT SStack_90;
  string errMsg;
  Object exports;
  char *fileName;
  SQInteger fileNameLen;
  SQUserPointer selfPtr;
  
  selfPtr = (SQUserPointer)0x0;
  SVar3 = sq_getuserpointer(vm,-1,&selfPtr);
  this = selfPtr;
  if (SVar3 < 0 || selfPtr == (SQUserPointer)0x0) {
    SStack_90 = sq_throwerror(vm,"No module manager");
  }
  else {
    fileName = (char *)0x0;
    fileNameLen = -1;
    sq_getstringandsize(vm,2,&fileName,&fileNameLen);
    __s = fileName;
    iVar2 = strcmp(fileName,"quirrel.native_modules");
    if (iVar2 == 0) {
      sq_newarray(vm,*(SQInteger *)((long)this + 0x68));
      plVar5 = (long *)((long)this + 0x60);
      n = 0;
      SStack_90 = 1;
      while (plVar5 = (long *)*plVar5, plVar5 != (long *)0x0) {
        sq_pushinteger(vm,n);
        sq_pushstring(vm,(SQChar *)plVar5[1],-1);
        sq_set(vm,-3);
        n = n + 1;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errMsg,__s,(allocator<char> *)&exports);
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)((long)this + 0x50),&errMsg);
      std::__cxx11::string::~string((string *)&errMsg);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_true>
          ._M_cur == (__node_type *)0x0) {
        Sqrat::Object::Object(&exports);
        errMsg._M_dataplus._M_p = (pointer)&errMsg.field_2;
        errMsg._M_string_length = 0;
        errMsg.field_2._M_local_buf[0] = '\0';
        bVar1 = requireModule((SqModules *)this,fileName,false,__fn__,&exports,&errMsg);
        if (bVar1) {
          sq_pushobject(vm,exports.obj);
          SStack_90 = 1;
        }
        else {
          SStack_90 = sq_throwerror(vm,errMsg._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&errMsg);
        Sqrat::Object::~Object(&exports);
      }
      else {
        sq_pushobject(vm,*(HSQOBJECT *)
                          ((long)iVar4.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_true>
                                 ._M_cur + 0x30));
        SStack_90 = 1;
      }
    }
  }
  return SStack_90;
}

Assistant:

SQInteger SqModules::sqRequire(HSQUIRRELVM vm)
{
  SQUserPointer selfPtr = nullptr;
  if (SQ_FAILED(sq_getuserpointer(vm, -1, &selfPtr)) || !selfPtr)
    return sq_throwerror(vm, "No module manager");

  SqModules *self = reinterpret_cast<SqModules *>(selfPtr);
  SQRAT_ASSERT(self->sqvm == vm);

  const char *fileName = nullptr;
  SQInteger fileNameLen = -1;
  sq_getstringandsize(vm, 2, &fileName, &fileNameLen);

  if (strcmp(fileName, "quirrel.native_modules")==0)
  {
    sq_newarray(vm, self->nativeModules.size());
    SQInteger idx = 0;
    for (auto &nm : self->nativeModules)
    {
      sq_pushinteger(vm, idx);
      sq_pushstring(vm, nm.first.data(), -1);
      sq_set(vm, -3);
      ++idx;
    }
    return 1;
  }

  auto nativeIt = self->nativeModules.find(fileName);
  if (nativeIt != self->nativeModules.end())
  {
    sq_pushobject(vm, nativeIt->second.GetObject());
    return 1;
  }

  Sqrat::Object exports;
  string errMsg;
  if (!self->requireModule(fileName, must_exist, __fn__, exports, errMsg))
    return sq_throwerror(vm, errMsg.c_str());

  sq_pushobject(vm, exports.GetObject());
  return 1;
}